

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIterativeSolverLS.cpp
# Opt level: O3

bool __thiscall chrono::ChSolverMINRES::SolveProblem(ChSolverMINRES *this)

{
  double dVar1;
  long lVar2;
  ostream *poVar3;
  assign_op<double,_double> local_29;
  SrcXprType local_28;
  
  lVar2 = (long)(this->super_ChIterativeSolverLS).super_ChIterativeSolver.m_max_iterations;
  if (0 < lVar2) {
    (this->m_engine->
    super_IterativeSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV,_3,_chrono::ChDiagonalPreconditioner>_>
    ).m_maxIterations = lVar2;
  }
  dVar1 = (this->super_ChIterativeSolverLS).super_ChIterativeSolver.m_tolerance;
  if (0.0 < dVar1) {
    (this->m_engine->
    super_IterativeSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV,_3,_chrono::ChDiagonalPreconditioner>_>
    ).m_tolerance = dVar1;
  }
  local_28.m_rhs = &(this->super_ChIterativeSolverLS).m_rhs;
  if ((this->super_ChIterativeSolverLS).super_ChIterativeSolver.m_warm_start == true) {
    local_28.m_dec = this->m_engine;
    if (((local_28.m_dec)->
        super_IterativeSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV,_3,_chrono::ChDiagonalPreconditioner>_>
        ).
        super_SparseSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV,_3,_chrono::ChDiagonalPreconditioner>_>
        .m_isInitialized == false) {
      __assert_fail("m_isInitialized && \"Solver is not initialized.\"",
                    "/usr/include/eigen3/Eigen/src/IterativeLinearSolvers/IterativeSolverBase.h",
                    0x140,
                    "const SolveWithGuess<Derived, Rhs, Guess> Eigen::IterativeSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV, 3, chrono::ChDiagonalPreconditioner>>::solveWithGuess(const MatrixBase<Rhs> &, const Guess &) const [Derived = Eigen::MINRES<chrono::ChMatrixSPMV, 3, chrono::ChDiagonalPreconditioner>, Rhs = Eigen::Matrix<double, -1, 1>, Guess = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    if ((((local_28.m_dec)->
         super_IterativeSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV,_3,_chrono::ChDiagonalPreconditioner>_>
         ).m_matrixWrapper.mp_matrix)->m_N !=
        (this->super_ChIterativeSolverLS).m_rhs.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      __assert_fail("derived().rows()==b.rows() && \"solve(): invalid number of rows of the right hand side matrix b\""
                    ,"/usr/include/eigen3/Eigen/src/IterativeLinearSolvers/IterativeSolverBase.h",
                    0x141,
                    "const SolveWithGuess<Derived, Rhs, Guess> Eigen::IterativeSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV, 3, chrono::ChDiagonalPreconditioner>>::solveWithGuess(const MatrixBase<Rhs> &, const Guess &) const [Derived = Eigen::MINRES<chrono::ChMatrixSPMV, 3, chrono::ChDiagonalPreconditioner>, Rhs = Eigen::Matrix<double, -1, 1>, Guess = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    local_28.m_guess = &(this->super_ChIterativeSolverLS).m_initguess;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::SolveWithGuess<Eigen::MINRES<chrono::ChMatrixSPMV,_3,_chrono::ChDiagonalPreconditioner>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&(this->super_ChIterativeSolverLS).m_sol,&local_28,&local_29);
  }
  else {
    local_28.m_dec = this->m_engine;
    if (((local_28.m_dec)->
        super_IterativeSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV,_3,_chrono::ChDiagonalPreconditioner>_>
        ).
        super_SparseSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV,_3,_chrono::ChDiagonalPreconditioner>_>
        .m_isInitialized == false) {
      __assert_fail("m_isInitialized && \"Solver is not initialized.\"",
                    "/usr/include/eigen3/Eigen/src/SparseCore/SparseSolverBase.h",0x5a,
                    "const Solve<Derived, Rhs> Eigen::SparseSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV, 3, chrono::ChDiagonalPreconditioner>>::solve(const MatrixBase<Rhs> &) const [Derived = Eigen::MINRES<chrono::ChMatrixSPMV, 3, chrono::ChDiagonalPreconditioner>, Rhs = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    if ((((local_28.m_dec)->
         super_IterativeSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV,_3,_chrono::ChDiagonalPreconditioner>_>
         ).m_matrixWrapper.mp_matrix)->m_N !=
        (this->super_ChIterativeSolverLS).m_rhs.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      __assert_fail("derived().rows()==b.rows() && \"solve(): invalid number of rows of the right hand side matrix b\""
                    ,"/usr/include/eigen3/Eigen/src/SparseCore/SparseSolverBase.h",0x5b,
                    "const Solve<Derived, Rhs> Eigen::SparseSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV, 3, chrono::ChDiagonalPreconditioner>>::solve(const MatrixBase<Rhs> &) const [Derived = Eigen::MINRES<chrono::ChMatrixSPMV, 3, chrono::ChDiagonalPreconditioner>, Rhs = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::MINRES<chrono::ChMatrixSPMV,_3,_chrono::ChDiagonalPreconditioner>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&(this->super_ChIterativeSolverLS).m_sol,(SrcXprType *)&local_28,&local_29);
  }
  if ((this->super_ChIterativeSolverLS).super_ChSolverLS.super_ChSolver.verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  MINRES iterations: ",0x15);
    if ((this->m_engine->
        super_IterativeSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV,_3,_chrono::ChDiagonalPreconditioner>_>
        ).
        super_SparseSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV,_3,_chrono::ChDiagonalPreconditioner>_>
        .m_isInitialized == false) {
      __assert_fail("m_isInitialized && \"ConjugateGradient is not initialized.\"",
                    "/usr/include/eigen3/Eigen/src/IterativeLinearSolvers/IterativeSolverBase.h",
                    0x12a,
                    "Index Eigen::IterativeSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV, 3, chrono::ChDiagonalPreconditioner>>::iterations() const [Derived = Eigen::MINRES<chrono::ChMatrixSPMV, 3, chrono::ChDiagonalPreconditioner>]"
                   );
    }
    poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," error: ",8);
    if ((this->m_engine->
        super_IterativeSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV,_3,_chrono::ChDiagonalPreconditioner>_>
        ).
        super_SparseSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV,_3,_chrono::ChDiagonalPreconditioner>_>
        .m_isInitialized == false) {
      __assert_fail("m_isInitialized && \"ConjugateGradient is not initialized.\"",
                    "/usr/include/eigen3/Eigen/src/IterativeLinearSolvers/IterativeSolverBase.h",
                    0x133,
                    "RealScalar Eigen::IterativeSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV, 3, chrono::ChDiagonalPreconditioner>>::error() const [Derived = Eigen::MINRES<chrono::ChMatrixSPMV, 3, chrono::ChDiagonalPreconditioner>]"
                   );
    }
    poVar3 = std::ostream::_M_insert<double>
                       ((this->m_engine->
                        super_IterativeSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV,_3,_chrono::ChDiagonalPreconditioner>_>
                        ).m_error);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  if ((this->m_engine->
      super_IterativeSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV,_3,_chrono::ChDiagonalPreconditioner>_>
      ).
      super_SparseSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV,_3,_chrono::ChDiagonalPreconditioner>_>
      .m_isInitialized != false) {
    return (this->m_engine->
           super_IterativeSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV,_3,_chrono::ChDiagonalPreconditioner>_>
           ).m_info == Success;
  }
  __assert_fail("m_isInitialized && \"IterativeSolverBase is not initialized.\"",
                "/usr/include/eigen3/Eigen/src/IterativeLinearSolvers/IterativeSolverBase.h",0x148,
                "ComputationInfo Eigen::IterativeSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV, 3, chrono::ChDiagonalPreconditioner>>::info() const [Derived = Eigen::MINRES<chrono::ChMatrixSPMV, 3, chrono::ChDiagonalPreconditioner>]"
               );
}

Assistant:

bool ChSolverMINRES::SolveProblem() {
    if (m_max_iterations > 0) {
        m_engine->setMaxIterations(m_max_iterations);
    }
    if (m_tolerance > 0) {
        m_engine->setTolerance(m_tolerance);
    }

    if (m_warm_start) {
        m_sol = m_engine->solveWithGuess(m_rhs, m_initguess);
    } else {
        m_sol = m_engine->solve(m_rhs);
    }

    if (verbose) {
        std::cout << "  MINRES iterations: " << m_engine->iterations() << " error: " << m_engine->error() << std::endl;
    }

    return (m_engine->info() == Eigen::Success);
}